

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_sinc.c
# Opt level: O0

SRC_ERROR prepare_data(SINC_FILTER *filter,int channels,SRC_DATA *data,int half_filter_chan_len)

{
  int iVar1;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int len;
  int half_filter_chan_len_local;
  SRC_DATA *data_local;
  int channels_local;
  SINC_FILTER *filter_local;
  
  if (filter->b_real_end < 0) {
    if (data->data_in == (float *)0x0) {
      filter_local._4_4_ = SRC_ERR_NO_ERROR;
    }
    else {
      if (filter->b_current == 0) {
        local_30 = filter->b_len + half_filter_chan_len * -2;
        filter->b_end = half_filter_chan_len;
        filter->b_current = half_filter_chan_len;
      }
      else if (filter->b_end + half_filter_chan_len + channels < filter->b_len) {
        if ((filter->b_len - filter->b_current) - half_filter_chan_len < 1) {
          local_34 = 0;
        }
        else {
          local_34 = (filter->b_len - filter->b_current) - half_filter_chan_len;
        }
        local_30 = local_34;
      }
      else {
        iVar1 = filter->b_end - filter->b_current;
        memmove(filter->buffer,
                filter->buffer + ((long)filter->b_current - (long)half_filter_chan_len),
                (long)(half_filter_chan_len + iVar1) << 2);
        filter->b_current = half_filter_chan_len;
        filter->b_end = filter->b_current + iVar1;
        if ((filter->b_len - filter->b_current) - half_filter_chan_len < 1) {
          local_38 = 0;
        }
        else {
          local_38 = (filter->b_len - filter->b_current) - half_filter_chan_len;
        }
        local_30 = local_38;
      }
      if ((int)filter->in_count - (int)filter->in_used < local_30) {
        local_3c = (int)filter->in_count - (int)filter->in_used;
      }
      else {
        local_3c = local_30;
      }
      local_3c = local_3c - local_3c % channels;
      if ((local_3c < 0) || (filter->b_len < filter->b_end + local_3c)) {
        filter_local._4_4_ = SRC_ERR_SINC_PREPARE_DATA_BAD_LEN;
      }
      else {
        memcpy(filter->buffer + filter->b_end,data->data_in + filter->in_used,(long)local_3c << 2);
        filter->b_end = local_3c + filter->b_end;
        filter->in_used = (long)local_3c + filter->in_used;
        if (((filter->in_used == filter->in_count) &&
            (iVar1 = filter->b_end - filter->b_current,
            SBORROW4(iVar1,half_filter_chan_len * 2) != iVar1 + half_filter_chan_len * -2 < 0)) &&
           (data->end_of_input != 0)) {
          if (filter->b_len - filter->b_end < half_filter_chan_len + 5) {
            iVar1 = filter->b_end - filter->b_current;
            memmove(filter->buffer,
                    filter->buffer + ((long)filter->b_current - (long)half_filter_chan_len),
                    (long)(half_filter_chan_len + iVar1) << 2);
            filter->b_current = half_filter_chan_len;
            filter->b_end = filter->b_current + iVar1;
          }
          filter->b_real_end = filter->b_end;
          local_30 = half_filter_chan_len + 5;
          if ((local_30 < 0) || (filter->b_len < filter->b_end + local_30)) {
            local_30 = filter->b_len - filter->b_end;
          }
          memset(filter->buffer + filter->b_end,0,(long)local_30 << 2);
          filter->b_end = local_30 + filter->b_end;
        }
        filter_local._4_4_ = SRC_ERR_NO_ERROR;
      }
    }
  }
  else {
    filter_local._4_4_ = SRC_ERR_NO_ERROR;
  }
  return filter_local._4_4_;
}

Assistant:

static SRC_ERROR
prepare_data (SINC_FILTER *filter, int channels, SRC_DATA *data, int half_filter_chan_len)
{	int len = 0 ;

	if (filter->b_real_end >= 0)
		return SRC_ERR_NO_ERROR ;	/* Should be terminating. Just return. */

	if (data->data_in == NULL)
		return SRC_ERR_NO_ERROR ;

	if (filter->b_current == 0)
	{	/* Initial state. Set up zeros at the start of the buffer and
		** then load new data after that.
		*/
		len = filter->b_len - 2 * half_filter_chan_len ;

		filter->b_current = filter->b_end = half_filter_chan_len ;
		}
	else if (filter->b_end + half_filter_chan_len + channels < filter->b_len)
	{	/*  Load data at current end position. */
		len = MAX (filter->b_len - filter->b_current - half_filter_chan_len, 0) ;
		}
	else
	{	/* Move data at end of buffer back to the start of the buffer. */
		len = filter->b_end - filter->b_current ;
		memmove (filter->buffer, filter->buffer + filter->b_current - half_filter_chan_len,
						(half_filter_chan_len + len) * sizeof (filter->buffer [0])) ;

		filter->b_current = half_filter_chan_len ;
		filter->b_end = filter->b_current + len ;

		/* Now load data at current end of buffer. */
		len = MAX (filter->b_len - filter->b_current - half_filter_chan_len, 0) ;
		} ;

	len = MIN ((int) (filter->in_count - filter->in_used), len) ;
	len -= (len % channels) ;

	if (len < 0 || filter->b_end + len > filter->b_len)
		return SRC_ERR_SINC_PREPARE_DATA_BAD_LEN ;

	memcpy (filter->buffer + filter->b_end, data->data_in + filter->in_used,
						len * sizeof (filter->buffer [0])) ;

	filter->b_end += len ;
	filter->in_used += len ;

	if (filter->in_used == filter->in_count &&
			filter->b_end - filter->b_current < 2 * half_filter_chan_len && data->end_of_input)
	{	/* Handle the case where all data in the current buffer has been
		** consumed and this is the last buffer.
		*/

		if (filter->b_len - filter->b_end < half_filter_chan_len + 5)
		{	/* If necessary, move data down to the start of the buffer. */
			len = filter->b_end - filter->b_current ;
			memmove (filter->buffer, filter->buffer + filter->b_current - half_filter_chan_len,
							(half_filter_chan_len + len) * sizeof (filter->buffer [0])) ;

			filter->b_current = half_filter_chan_len ;
			filter->b_end = filter->b_current + len ;
			} ;

		filter->b_real_end = filter->b_end ;
		len = half_filter_chan_len + 5 ;

		if (len < 0 || filter->b_end + len > filter->b_len)
			len = filter->b_len - filter->b_end ;

		memset (filter->buffer + filter->b_end, 0, len * sizeof (filter->buffer [0])) ;
		filter->b_end += len ;
		} ;

	return SRC_ERR_NO_ERROR ;
}